

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall
amrex::Amr::grid_places
          (Amr *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  Long LVar4;
  Print *pPVar5;
  Print *x;
  Print *in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double stoptime;
  Box bx_2;
  int i_2;
  int ngrid_2;
  BoxList bl_2;
  int lev_2;
  Box bx_1;
  int i_1;
  int ngrid_1;
  BoxList bl_1;
  int lev_1;
  Box bx;
  int i;
  int ngrid;
  BoxList bl;
  int lev;
  double strttime;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_00000610;
  int *in_stack_00000618;
  Real in_stack_00000620;
  int in_stack_0000062c;
  AmrMesh *in_stack_00000630;
  BoxArray *in_stack_fffffffffffffc78;
  Print *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  BoxArray *in_stack_fffffffffffffc90;
  BoxArray *in_stack_fffffffffffffca8;
  Print *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  BoxArray *in_stack_fffffffffffffcd0;
  Print *in_stack_fffffffffffffcf0;
  IntVect *in_stack_fffffffffffffd40;
  BoxArray *in_stack_fffffffffffffd48;
  double local_1a8 [5];
  int local_180;
  int local_17c;
  int local_158;
  int local_154;
  int local_150 [6];
  AmrMesh *in_stack_fffffffffffffec8;
  int local_130;
  int local_108;
  int local_104;
  int local_100 [12];
  int local_d0;
  int local_cc;
  int local_a4;
  int local_a0;
  int local_9c [27];
  double local_30;
  Print *local_20;
  double local_18;
  int local_c;
  
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  local_30 = second();
  if (local_c == 0) {
    AmrMesh::MakeBaseGrids(in_stack_fffffffffffffec8);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    BoxArray::operator=((BoxArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffc80);
  }
  if ((((local_18 != 0.0) || (NAN(local_18))) ||
      (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) ||
     ((*(byte *)(in_RDI + 0x80) & 1) != 0)) {
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && ((*(byte *)(in_RDI + 0x80) & 1) != 0)) {
      local_100[0] = *(int *)(in_RDI + 0x94) + 1;
      piVar3 = std::min<int>((int *)(in_RDI + 0xc),local_100);
      local_20->rank = *piVar3;
      in_stack_fffffffffffffcb0 = local_20;
      LVar4 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                        ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x138c31d);
      local_104 = (int)LVar4;
      piVar3 = std::min<int>(&in_stack_fffffffffffffcb0->rank,&local_104);
      local_20->rank = *piVar3;
      local_108 = local_c;
      while (local_108 = local_108 + 1, local_108 <= local_20->rank) {
        BoxList::BoxList((BoxList *)in_stack_fffffffffffffc78);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        LVar4 = BoxArray::size((BoxArray *)0x138c398);
        for (local_130 = 0; local_130 < (int)LVar4; local_130 = local_130 + 1) {
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          BoxArray::operator[]
                    (in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          if (local_c < local_108) {
            BoxList::push_back((BoxList *)in_stack_fffffffffffffc80,(Box *)in_stack_fffffffffffffc78
                              );
          }
        }
        if (local_c < local_108) {
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          BoxArray::define(in_stack_fffffffffffffcd0,
                           (BoxList *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8))
          ;
        }
        in_stack_fffffffffffffca8 =
             Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                   in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        BoxArray::maxSize(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        BoxList::~BoxList((BoxList *)0x138c4da);
      }
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_150[0] = *(int *)(in_RDI + 0x94) + 1;
        piVar3 = std::min<int>((int *)(in_RDI + 0xc),local_150);
        pPVar5 = local_20;
        local_20->rank = *piVar3;
        LVar4 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                          ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x138c560);
        local_154 = (int)LVar4;
        piVar3 = std::min<int>(&pPVar5->rank,&local_154);
        local_20->rank = *piVar3;
        for (local_158 = 1; local_158 <= local_20->rank; local_158 = local_158 + 1) {
          BoxList::BoxList((BoxList *)in_stack_fffffffffffffc78);
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          LVar4 = BoxArray::size((BoxArray *)0x138c5d5);
          local_17c = (int)LVar4;
          for (local_180 = 0; local_180 < local_17c; local_180 = local_180 + 1) {
            Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                       in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
            BoxArray::operator[]
                      (in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
            if (local_c < local_158) {
              BoxList::push_back((BoxList *)in_stack_fffffffffffffc80,
                                 (Box *)in_stack_fffffffffffffc78);
            }
          }
          if (local_c < local_158) {
            Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                       in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
            BoxArray::define(in_stack_fffffffffffffcd0,
                             (BoxList *)
                             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
          }
          BoxList::~BoxList((BoxList *)0x138c6d8);
        }
        return;
      }
    }
    AmrMesh::MakeNewGrids
              (in_stack_00000630,in_stack_0000062c,in_stack_00000620,in_stack_00000618,
               in_stack_00000610);
    if (0 < *(int *)(in_RDI + 8)) {
      local_1a8[0] = second();
      local_1a8[0] = local_1a8[0] - local_30;
      iVar1 = ParallelDescriptor::IOProcessorNumber();
      ParallelDescriptor::ReduceRealMax<double>(local_1a8,iVar1);
      OutStream();
      Print::Print(in_stack_fffffffffffffcb0,(ostream *)in_stack_fffffffffffffca8);
      Print::operator<<(in_stack_fffffffffffffc80,(char (*) [21])in_stack_fffffffffffffc78);
      Print::operator<<(in_stack_fffffffffffffc80,(double *)in_stack_fffffffffffffc78);
      pPVar5 = Print::operator<<(in_stack_fffffffffffffc80,(char (*) [14])in_stack_fffffffffffffc78)
      ;
      x = Print::operator<<(pPVar5,(int *)in_stack_fffffffffffffc78);
      Print::operator<<(pPVar5,(char *)x);
      Print::~Print(in_stack_fffffffffffffcf0);
    }
  }
  else {
    local_9c[0] = *(int *)(in_RDI + 0x94) + 1;
    piVar3 = std::min<int>((int *)(in_RDI + 0xc),local_9c);
    pPVar5 = local_20;
    local_20->rank = *piVar3;
    LVar4 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x138c10d);
    local_a0 = (int)LVar4;
    piVar3 = std::min<int>(&pPVar5->rank,&local_a0);
    local_20->rank = *piVar3;
    for (local_a4 = 1; local_a4 <= local_20->rank; local_a4 = local_a4 + 1) {
      BoxList::BoxList((BoxList *)in_stack_fffffffffffffc78);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
      LVar4 = BoxArray::size((BoxArray *)0x138c182);
      local_cc = (int)LVar4;
      for (local_d0 = 0; local_d0 < local_cc; local_d0 = local_d0 + 1) {
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        BoxArray::operator[]
                  (in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
        if (local_c < local_a4) {
          BoxList::push_back((BoxList *)in_stack_fffffffffffffc80,(Box *)in_stack_fffffffffffffc78);
        }
      }
      if (local_c < local_a4) {
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        BoxArray::define(in_stack_fffffffffffffcd0,
                         (BoxList *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      }
      BoxList::~BoxList((BoxList *)0x138c285);
    }
  }
  return;
}

Assistant:

void
Amr::grid_places (int              lbase,
                  Real             time,
                  int&             new_finest,
                  Vector<BoxArray>& new_grids)
{
    BL_PROFILE("Amr::grid_places()");

    const auto strttime = amrex::second();

    if (lbase == 0)
    {
        new_grids[0] = MakeBaseGrids();
    }

    if ( time == 0. && !initial_grids_file.empty() && !use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    // Use grids in initial_grids_file as fixed coarse grids.
    if ( ! initial_grids_file.empty() && use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = lbase+1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);

                if (lev > lbase)
                    bl.push_back(bx);

            }
            if (lev > lbase)
                new_grids[lev].define(bl);
            new_grids[lev].maxSize(max_grid_size[lev]);
        }
    }
    else if ( !regrid_grids_file.empty() )     // Use grids in regrid_grids_file
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,regrid_ba.size());
        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = regrid_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(regrid_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    MakeNewGrids(lbase, time, new_finest, new_grids);

    if (verbose > 0)
    {
        auto stoptime = amrex::second() - strttime;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(stoptime,ParallelDescriptor::IOProcessorNumber());
            amrex::Print() << "grid_places() time: " << stoptime << " new finest: " << new_finest<< '\n';
#ifdef BL_LAZY
        });
#endif
    }
}